

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O3

char * google::protobuf::internal::TcParser::FastMdS1
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  ErrnoSaver EVar1;
  bool bVar2;
  uint uVar3;
  TcParseTableBase *pTVar4;
  MessageLite *pMVar5;
  ulong uVar6;
  char *pcVar7;
  Nonnull<const_char_*> failure_msg;
  int iVar8;
  Arena *arena;
  uint *puVar9;
  MessageLite *unaff_R13;
  long *plVar10;
  ushort *puVar11;
  pair<const_char_*,_int> pVar12;
  TcParseTableBase *unaff_retaddr;
  ErrnoSaver local_48;
  char *local_38;
  
  if (data.field_0._0_1_ != '\0') {
    pcVar7 = MiniParse(msg,ptr,ctx,data,table,hasbits);
    return pcVar7;
  }
  if ((ulong)table->has_bits_offset != 0) {
    puVar9 = (uint *)((long)&msg->_vptr_MessageLite + (ulong)table->has_bits_offset);
    if (((ulong)puVar9 & 3) != 0) {
      AlignFail();
    }
    *puVar9 = *puVar9 | (uint)hasbits | (uint)(1L << (data.field_0._2_1_ & 0x3f));
  }
  plVar10 = (long *)((long)&msg->_vptr_MessageLite + ((ulong)data.field_0 >> 0x30));
  if (((ulong)plVar10 & 7) != 0) {
    AlignFail(plVar10);
  }
  pTVar4 = MessageLite::GetTcParseTable
                     (*(MessageLite **)
                       ((long)&table->has_bits_offset +
                       ((ulong)data.field_0 >> 0x18 & 0xff) * 8 + (ulong)table->aux_offset));
  if (*plVar10 == 0) {
    arena = (Arena *)(msg->_internal_metadata_).ptr_;
    if (((ulong)arena & 1) != 0) {
      arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
    }
    pMVar5 = ClassData::New(pTVar4->class_data,arena);
    *plVar10 = (long)pMVar5;
  }
  if (ptr[1] < '\0') {
    pVar12 = ReadSizeFallback(ptr + 1,(uint)(byte)ptr[1]);
    puVar11 = (ushort *)pVar12.first;
    if (puVar11 == (ushort *)0x0) {
      return (char *)0x0;
    }
  }
  else {
    puVar11 = (ushort *)(ptr + 2);
  }
  if (ctx->depth_ < 1) {
    return (char *)0x0;
  }
  EpsCopyInputStream::PushLimit
            ((EpsCopyInputStream *)&stack0xffffffffffffffb8,(char *)ctx,(int)puVar11);
  EVar1.saved_errno_ = local_48.saved_errno_;
  local_38 = (char *)((long)ctx->depth_ + -1);
  ctx->depth_ = (int)local_38;
  pMVar5 = (MessageLite *)*plVar10;
  _local_48 = puVar11;
  while (bVar2 = EpsCopyInputStream::DoneWithCheck<false>
                           (&ctx->super_EpsCopyInputStream,(char **)&stack0xffffffffffffffb8,
                            ctx->group_depth_), !bVar2) {
    uVar3 = (uint)pTVar4->fast_idx_mask & (uint)*_local_48;
    if ((uVar3 & 7) != 0) {
      protobuf_assumption_failed
                ("(idx & 7) == 0",
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
                 ,0x452);
    }
    uVar6 = (ulong)(uVar3 & 0xfffffff8);
    _local_48 = (ushort *)
                (**(code **)(&pTVar4[1].has_bits_offset + uVar6))
                          (pMVar5,_local_48,ctx,
                           (ulong)*_local_48 ^ *(ulong *)(&pTVar4[1].fast_idx_mask + uVar6 * 2),
                           pTVar4,0);
    if ((_local_48 == (ushort *)0x0) || ((ctx->super_EpsCopyInputStream).last_tag_minus_1_ != 0))
    break;
  }
  if ((pTVar4->field_0x9 & 1) == 0) {
    if (_local_48 == (ushort *)0x0) {
      VerifyHasBitConsistency(unaff_R13,unaff_retaddr);
      puVar11 = _local_48;
      goto LAB_0020dd2b;
    }
    iVar8 = ctx->depth_;
    puVar11 = _local_48;
  }
  else {
    puVar11 = (ushort *)(*pTVar4->post_loop_handler)(pMVar5,(char *)_local_48,ctx);
LAB_0020dd2b:
    iVar8 = ctx->depth_;
    if (puVar11 == (ushort *)0x0) {
      puVar11 = (ushort *)0x0;
      goto LAB_0020dc75;
    }
  }
  if ((int)local_38 != iVar8) {
    failure_msg = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                            ((long)local_38,(long)iVar8,"old_depth == depth_");
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&stack0xffffffffffffffb8,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/parse_context.h"
               ,0x481,failure_msg);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&stack0xffffffffffffffb8);
  }
LAB_0020dc75:
  ctx->depth_ = iVar8 + 1;
  uVar3 = EVar1.saved_errno_ + (ctx->super_EpsCopyInputStream).limit_;
  (ctx->super_EpsCopyInputStream).limit_ = uVar3;
  if ((ctx->super_EpsCopyInputStream).last_tag_minus_1_ != 0) {
    return (char *)0x0;
  }
  (ctx->super_EpsCopyInputStream).limit_end_ =
       (ctx->super_EpsCopyInputStream).buffer_end_ + (int)((int)uVar3 >> 0x1f & uVar3);
  return (char *)puVar11;
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::FastMdS1(PROTOBUF_TC_PARAM_DECL) {
  PROTOBUF_MUSTTAIL return SingularParseMessageAuxImpl<uint8_t, false, false>(
      PROTOBUF_TC_PARAM_PASS);
}